

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::~PortConnectionBuilder
          (PortConnectionBuilder *this)

{
  pointer p;
  pointer p_00;
  
  p = (this->instanceDims).super_SmallVectorBase<slang::ConstantRange>.data_;
  if (p != (pointer)(this->instanceDims).super_SmallVectorBase<slang::ConstantRange>.firstElement) {
    operator_delete(p);
  }
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::delete_(*(Storage **)&(this->connMap).namedConns.super_Storage.field_0x108,
            (table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)&(this->connMap).namedConns.field_0x110);
  p_00 = (this->connMap).orderedConns.
         super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.data_;
  if (p_00 != (pointer)(this->connMap).orderedConns.
                       super_SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>.
                       firstElement) {
    operator_delete(p_00);
    return;
  }
  return;
}

Assistant:

PortConnectionBuilder(const InstanceSymbol& instance,
                          const SeparatedSyntaxList<PortConnectionSyntax>& portConnections) :
        scope(*instance.getParentScope()), instance(instance), comp(scope.getCompilation()),
        lookupLocation(LookupLocation::after(instance)),
        connMap(portConnections, scope, lookupLocation) {

        // Build up the set of dimensions for the instantiating instance's array parent, if any.
        // This builds up the dimensions in reverse order, so we have to reverse them back.
        auto parent = &scope;
        while (parent && parent->asSymbol().kind == SymbolKind::InstanceArray) {
            auto& sym = parent->asSymbol().as<InstanceArraySymbol>();
            instanceDims.push_back(sym.range);
            parent = sym.getParentScope();
        }
        std::ranges::reverse(instanceDims);
    }